

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

void __thiscall helics::FederateInfo::injectParser(FederateInfo *this,App *app)

{
  pointer this_00;
  HelicsConfigJSON *this_01;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *in_RSI;
  helicsCLI11App *in_stack_00000010;
  HelicsConfigJSON *fmtr;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> lparser;
  App *in_stack_00000120;
  FederateInfo *in_stack_00001f08;
  function<void_()> *in_stack_ffffffffffffff28;
  App *in_stack_ffffffffffffff30;
  HelicsConfigJSON *this_02;
  anon_class_16_2_20c23b14 *in_stack_ffffffffffffff38;
  function<void_()> *in_stack_ffffffffffffff40;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  App_p *in_stack_ffffffffffffffc8;
  App *in_stack_ffffffffffffffd0;
  allocator<char> local_18 [8];
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *local_10;
  
  __a = local_18;
  local_10 = in_RSI;
  makeCLIApp(in_stack_00001f08);
  this_00 = CLI::std::
            unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
            operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x3672c0);
  CLI::App::allow_extras(&this_00->super_App,false);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x3672d9);
  helicsCLI11App::add_config_validation(in_stack_00000010);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x3672f0);
  std::function<void()>::function<helics::FederateInfo::injectParser(CLI::App*)::__0,void>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  CLI::App::final_callback(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  CLI::std::function<void_()>::~function((function<void_()> *)0x36734d);
  std::shared_ptr<CLI::App>::
  shared_ptr<helics::helicsCLI11App,std::default_delete<helics::helicsCLI11App>,void>
            ((shared_ptr<CLI::App> *)in_stack_ffffffffffffff30,
             (unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             in_stack_ffffffffffffff28);
  CLI::App::add_subcommand(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  CLI::std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x367389);
  this_01 = addJsonConfig(in_stack_00000120);
  CLI::ConfigBase::maxLayers(&this_01->super_ConfigBase,'\0');
  this_02 = (HelicsConfigJSON *)&stack0xffffffffffffff6f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__a);
  HelicsConfigJSON::promoteSection(this_02,(string *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr(local_10);
  return;
}

Assistant:

void FederateInfo::injectParser(CLI::App* app)
{
    auto lparser = makeCLIApp();
    // extras need to go up into the parent app
    lparser->allow_extras(false);
    lparser->add_config_validation();
    lparser->final_callback([app, this]() { config_additional(app); });
    app->add_subcommand(std::move(lparser));
    // make sure the injector has json configuration handling capability
    auto* fmtr = addJsonConfig(app);
    fmtr->maxLayers(0);
    fmtr->promoteSection("helics");
}